

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O1

void __thiscall wasm::Instrumenter::instrumentFuncs(Instrumenter *this)

{
  StorageKind SVar1;
  pointer puVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t sVar5;
  Function *pFVar6;
  Name memory;
  undefined4 *puVar7;
  undefined4 *puVar8;
  Expression *pEVar9;
  Expression *pEVar10;
  Block *pBVar11;
  pointer puVar12;
  Const *pCVar13;
  Const *value;
  Store *first;
  Type TVar14;
  Function *pFVar15;
  Fatal *this_00;
  Address offset;
  pointer puVar16;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  Memory *pMVar17;
  undefined1 auStack_208 [8];
  Name memoryName;
  char *local_78;
  char *command;
  char *local_68;
  pointer local_60;
  Instrumenter *local_58;
  char *local_50;
  pointer local_48;
  Function *local_40;
  Builder local_38;
  Builder builder;
  
  local_38.wasm = this->wasm;
  SVar1 = this->config->storageKind;
  if (SVar1 - InMemory < 2) {
    if ((((local_38.wasm)->features).features & 1) == 0) {
      local_78 = "--in-secondary-memory";
      if (SVar1 == InMemory) {
        local_78 = "--in-memory";
      }
      local_78 = local_78 + 2;
      Fatal::Fatal((Fatal *)auStack_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&memoryName.super_IString.str._M_str,"error: --",9);
      this_00 = Fatal::operator<<((Fatal *)auStack_208,&local_78);
      Fatal::operator<<(this_00,(char (*) [32])" requires atomics to be enabled");
      Fatal::~Fatal((Fatal *)auStack_208);
    }
    puVar2 = ((local_38.wasm)->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar2 == ((local_38.wasm)->memories).
                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("!wasm->memories.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/instrumenter.cpp"
                    ,0x8d,"void wasm::Instrumenter::instrumentFuncs()");
    }
    if (SVar1 == InMemory) {
      pMVar17 = (puVar2->_M_t).
                super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    }
    else {
      pMVar17 = (Memory *)&this->secondaryMemory;
    }
    auStack_208 = *(undefined1 (*) [8])&(pMVar17->super_Importable).super_Named.name;
    memoryName.super_IString.str._M_len =
         *(size_t *)((long)&(pMVar17->super_Importable).super_Named.name + 8);
    puVar16 = ((local_38.wasm)->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pFVar15 = (Function *)
              ((local_38.wasm)->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((Function *)puVar16 != pFVar15) {
      offset.addr = 0;
      local_40 = pFVar15;
      do {
        pFVar6 = (puVar16->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar6->super_Importable).module + 8) == (char *)0x0) {
          local_48 = (pointer)offset.addr;
          pCVar13 = Builder::makeConstPtr(&local_38,0,(Type)0x2);
          value = Builder::makeConst<unsigned_int>(&local_38,1);
          memory.super_IString.str._M_str = (char *)memoryName.super_IString.str._M_len;
          memory.super_IString.str._M_len = (size_t)auStack_208;
          first = Builder::makeStore(&local_38,1,offset,1,(Expression *)pCVar13,(Expression *)value,
                                     (Type)0x2,memory);
          first->isAtomic = true;
          pEVar9 = pFVar6->body;
          TVar14.id = (uintptr_t)Builder::makeBlock(&local_38,(Expression *)first);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     (TVar14.id + 0x20),pEVar9);
          wasm::Block::finalize(TVar14);
          pFVar6->body = (Expression *)TVar14.id;
          offset.addr = (address64_t)((int)local_48 + 1);
          pFVar15 = local_40;
        }
        puVar16 = puVar16 + 1;
      } while ((Function *)puVar16 != pFVar15);
    }
  }
  else if (SVar1 == InGlobals) {
    puVar16 = ((local_38.wasm)->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar12 = ((local_38.wasm)->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar16 != puVar12) {
      local_48 = (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_60 = puVar12;
      local_58 = this;
      do {
        local_40 = (puVar16->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(local_40->super_Importable).module + 8) == (char *)0x0) {
          uVar3 = (local_48->super_IString).str._M_len;
          pcVar4 = (local_48->super_IString).str._M_str;
          puVar7 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          *puVar7 = 10;
          *(undefined8 *)(puVar7 + 2) = 0;
          *(undefined8 *)(puVar7 + 4) = 0;
          *(undefined8 *)(puVar7 + 4) = uVar3;
          *(char **)(puVar7 + 6) = pcVar4;
          *(undefined8 *)(puVar7 + 2) = 2;
          command = (char *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          command[0] = '\x0f';
          command[1] = '\0';
          command[2] = '\0';
          command[3] = '\0';
          command[8] = '\0';
          command[9] = '\0';
          command[10] = '\0';
          command[0xb] = '\0';
          command[0xc] = '\0';
          command[0xd] = '\0';
          command[0xe] = '\0';
          command[0xf] = '\0';
          command[0x10] = '\x14';
          command[0x11] = '\0';
          command[0x12] = '\0';
          command[0x13] = '\0';
          *(undefined4 **)(command + 0x18) = puVar7;
          wasm::Unary::finalize();
          sVar5 = (this->counterGlobal).super_IString.str._M_len;
          pcVar4 = (this->counterGlobal).super_IString.str._M_str;
          puVar7 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          *puVar7 = 10;
          *(undefined8 *)(puVar7 + 2) = 0;
          *(undefined8 *)(puVar7 + 4) = 0;
          *(size_t *)(puVar7 + 4) = sVar5;
          *(char **)(puVar7 + 6) = pcVar4;
          *(undefined8 *)(puVar7 + 2) = 2;
          local_50 = pcVar4;
          wasm::Literal::makeOne((Type)auStack_208);
          pCVar13 = Builder::makeConst(&local_38,(Literal *)auStack_208);
          puVar8 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
          *puVar8 = 0x10;
          *(undefined8 *)(puVar8 + 2) = 0;
          puVar8[4] = 0;
          *(undefined4 **)(puVar8 + 6) = puVar7;
          *(Const **)(puVar8 + 8) = pCVar13;
          wasm::Binary::finalize();
          pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
          pEVar9->_id = GlobalSetId;
          (pEVar9->type).id = 0;
          *(undefined8 *)(pEVar9 + 1) = 0;
          *(size_t *)(pEVar9 + 1) = sVar5;
          pEVar9[1].type.id = (uintptr_t)local_50;
          *(undefined4 **)(pEVar9 + 2) = puVar8;
          wasm::GlobalSet::finalize();
          local_50 = (char *)(local_48->super_IString).str._M_len;
          local_68 = (local_48->super_IString).str._M_str;
          sVar5 = (local_58->counterGlobal).super_IString.str._M_len;
          pcVar4 = (local_58->counterGlobal).super_IString.str._M_str;
          puVar7 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          *puVar7 = 10;
          *(undefined8 *)(puVar7 + 2) = 0;
          *(undefined8 *)(puVar7 + 4) = 0;
          *(size_t *)(puVar7 + 4) = sVar5;
          *(char **)(puVar7 + 6) = pcVar4;
          *(undefined8 *)(puVar7 + 2) = 2;
          pEVar10 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
          pEVar10->_id = GlobalSetId;
          (pEVar10->type).id = 0;
          *(undefined8 *)(pEVar10 + 1) = 0;
          *(char **)(pEVar10 + 1) = local_50;
          pEVar10[1].type.id = (uintptr_t)local_68;
          *(undefined4 **)(pEVar10 + 2) = puVar7;
          wasm::GlobalSet::finalize();
          pBVar11 = Builder::makeBlock(&local_38,pEVar9);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(pBVar11->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     pEVar10);
          wasm::Block::finalize();
          pEVar10 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
          pEVar10->_id = IfId;
          (pEVar10->type).id = 0;
          *(undefined8 *)(pEVar10 + 2) = 0;
          *(char **)(pEVar10 + 1) = command;
          pEVar10[1].type.id = (uintptr_t)pBVar11;
          wasm::If::finalize();
          pEVar9 = local_40->body;
          TVar14.id = (uintptr_t)Builder::makeBlock(&local_38,pEVar10);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     (TVar14.id + 0x20),pEVar9);
          wasm::Block::finalize(TVar14);
          local_40->body = (Expression *)TVar14.id;
          wasm::Literal::~Literal((Literal *)auStack_208);
          local_48 = local_48 + 1;
          puVar12 = local_60;
          this = local_58;
        }
        puVar16 = puVar16 + 1;
      } while (puVar16 != puVar12);
    }
  }
  return;
}

Assistant:

void Instrumenter::instrumentFuncs() {
  // Inject code at the beginning of each function to advance the monotonic
  // counter and set the function's timestamp if it hasn't already been set.
  Builder builder(*wasm);
  switch (config.storageKind) {
    case WasmSplitOptions::StorageKind::InGlobals: {
      // (if (i32.eqz (global.get $timestamp))
      //   (block
      //     (global.set $monotonic_counter
      //       (i32.add
      //         (global.get $monotonic_counter)
      //         (i32.const 1)
      //       )
      //     )
      //     (global.set $timestamp
      //       (global.get $monotonic_counter)
      //     )
      //   )
      // )
      auto globalIt = functionGlobals.begin();
      ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
        func->body = builder.makeSequence(
          builder.makeIf(
            builder.makeUnary(EqZInt32,
                              builder.makeGlobalGet(*globalIt, Type::i32)),
            builder.makeSequence(
              builder.makeGlobalSet(
                counterGlobal,
                builder.makeBinary(
                  AddInt32,
                  builder.makeGlobalGet(counterGlobal, Type::i32),
                  builder.makeConst(Literal::makeOne(Type::i32)))),
              builder.makeGlobalSet(
                *globalIt, builder.makeGlobalGet(counterGlobal, Type::i32)))),
          func->body,
          func->body->type);
        ++globalIt;
      });
      break;
    }
    case WasmSplitOptions::StorageKind::InMemory:
    case WasmSplitOptions::StorageKind::InSecondaryMemory: {
      if (!wasm->features.hasAtomics()) {
        const char* command =
          config.storageKind == WasmSplitOptions::StorageKind::InMemory
            ? "in-memory"
            : "in-secondary-memory";
        Fatal() << "error: --" << command << " requires atomics to be enabled";
      }
      // (i32.atomic.store8 offset=funcidx (i32.const 0) (i32.const 1))
      Index funcIdx = 0;
      assert(!wasm->memories.empty());
      Name memoryName =
        config.storageKind == WasmSplitOptions::StorageKind::InMemory
          ? wasm->memories[0]->name
          : secondaryMemory;
      ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
        func->body = builder.makeSequence(
          builder.makeAtomicStore(1,
                                  funcIdx,
                                  builder.makeConstPtr(0, Type::i32),
                                  builder.makeConst(uint32_t(1)),
                                  Type::i32,
                                  memoryName),
          func->body,
          func->body->type);
        ++funcIdx;
      });
      break;
    }
  }
}